

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  iVar1 = stbi__jpeg_info(s,x,y,comp);
  if (iVar1 == 0) {
    iVar1 = stbi__png_info(s,x,y,comp);
    if (iVar1 == 0) {
      iVar1 = stbi__gif_info(s,x,y,comp);
      if (iVar1 == 0) {
        iVar1 = stbi__bmp_info(s,x,y,comp);
        if (iVar1 == 0) {
          iVar1 = stbi__psd_info(s,x,y,comp);
          if (iVar1 == 0) {
            iVar1 = stbi__pic_info(s,x,y,comp);
            if (iVar1 == 0) {
              iVar1 = stbi__pnm_info(s,x,y,comp);
              if (iVar1 == 0) {
                iVar1 = stbi__hdr_info(s,x,y,comp);
                if (iVar1 == 0) {
                  iVar1 = stbi__tga_info(s,x,y,comp);
                  if (iVar1 == 0) {
                    s_local._4_4_ = stbi__err("unknown image type");
                  }
                  else {
                    s_local._4_4_ = 1;
                  }
                }
                else {
                  s_local._4_4_ = 1;
                }
              }
              else {
                s_local._4_4_ = 1;
              }
            }
            else {
              s_local._4_4_ = 1;
            }
          }
          else {
            s_local._4_4_ = 1;
          }
        }
        else {
          s_local._4_4_ = 1;
        }
      }
      else {
        s_local._4_4_ = 1;
      }
    }
    else {
      s_local._4_4_ = 1;
    }
  }
  else {
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}